

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1593.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long unmet;
  long local_30;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x24,iVar2,uVar4);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  lVar5 = curl_easy_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x26);
    iVar2 = 0x7c;
  }
  lVar6 = 0;
  if (lVar5 == 0) goto LAB_0010139d;
  iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
  uVar1 = _stderr;
  iVar2 = 0;
  if (iVar3 != 0) {
    uVar4 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                  ,0x28,iVar3,uVar4);
    iVar2 = iVar3;
  }
  if (iVar2 == 0) {
    iVar3 = curl_easy_setopt(lVar5,0x21,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                    ,0x29,iVar3,uVar4);
      iVar2 = iVar3;
    }
    lVar6 = 0;
    if (iVar2 != 0) goto LAB_0010139d;
    iVar3 = curl_easy_setopt(lVar5,0x22,0x5d5a7a78);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                    ,0x2b,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      lVar6 = curl_slist_append(0,"If-Modified-Since:");
      if (lVar6 == 0) {
        lVar6 = 0;
        iVar2 = 0x7e;
      }
      else {
        iVar3 = curl_easy_setopt(lVar5,0x2727,lVar6);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1593.c"
                        ,0x33,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if ((iVar2 == 0) && (iVar2 = curl_easy_perform(lVar5), iVar2 == 0)) {
          iVar3 = curl_easy_getinfo(lVar5,0x200023,&local_30);
          iVar2 = 0x77;
          if (local_30 == 1) {
            iVar2 = iVar3;
          }
          if (iVar3 != 0) {
            iVar2 = iVar3;
          }
        }
      }
      goto LAB_0010139d;
    }
  }
  lVar6 = 0;
LAB_0010139d:
  curl_easy_cleanup(lVar5);
  curl_slist_free_all(lVar6);
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
  struct curl_slist *header = NULL;
  long unmet;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMECONDITION, (long)CURL_TIMECOND_IFMODSINCE);
  /* Some TIMEVALUE; it doesn't matter. */
  easy_setopt(curl, CURLOPT_TIMEVALUE, 1566210680L);

  header = curl_slist_append(NULL, "If-Modified-Since:");
  if(!header) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_HTTPHEADER, header);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* Confirm that the condition checking still worked, even though we
   * suppressed the actual header.
   * The server returns 304, which means the condition is "unmet".
   */

  res = curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &unmet);
  if(res)
    goto test_cleanup;

  if(unmet != 1L) {
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_slist_free_all(header);
  curl_global_cleanup();

  return res;
}